

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O1

int mdb_page_search_root(MDB_cursor *mc,MDB_val *key,int flags)

{
  uint *puVar1;
  ushort uVar2;
  MDB_page *pMVar3;
  int iVar4;
  MDB_node *pMVar5;
  ulong uVar6;
  int in_R8D;
  int unaff_R13D;
  uint uVar7;
  bool bVar8;
  MDB_page *mp;
  int exact;
  MDB_page *local_48;
  int local_3c;
  MDB_val *local_38;
  
  local_48 = mc->mc_pg[mc->mc_top];
  local_38 = key;
  do {
    pMVar3 = local_48;
    if ((local_48->mp_flags & 1) == 0) {
      if ((local_48->mp_flags & 2) == 0) {
        puVar1 = &mc->mc_txn->mt_flags;
        *puVar1 = *puVar1 | 2;
        return -0x784c;
      }
      mc->mc_flags = (mc->mc_flags & 0xfffffffc) + 1;
      return 0;
    }
    if ((mc->mc_dbi != 0) && (((local_48->mp_pb).pb.pb_lower & 0xfffc) == 0x10)) {
      mdb_assert_fail(mc->mc_txn->mt_env,"!mc->mc_dbi || NUMKEYS(mp) > 1","mdb_page_search_root",
                      (char *)0x1789,in_R8D);
    }
    if ((flags & 0xcU) == 0) {
      pMVar5 = mdb_node_search(mc,local_38,&local_3c);
      if (pMVar5 == (MDB_node *)0x0) goto LAB_0010c89f;
      uVar2 = mc->mc_ki[mc->mc_top];
      uVar6 = (ulong)uVar2;
      uVar7 = (uint)uVar2;
      if (local_3c != 0) goto LAB_0010c8b2;
      if (uVar2 == 0) {
        mdb_assert_fail(mc->mc_txn->mt_env,"i > 0","mdb_page_search_root",(char *)0x1798,in_R8D);
      }
LAB_0010c8af:
      uVar6 = (ulong)(uVar7 - 1);
    }
    else {
      if ((flags & 8U) != 0) {
LAB_0010c89f:
        uVar7 = (pMVar3->mp_pb).pb.pb_lower + 0x1fff0 >> 1;
        goto LAB_0010c8af;
      }
      uVar6 = 0;
    }
LAB_0010c8b2:
    if ((pMVar3->mp_pb).pb.pb_lower - 0x10 >> 1 <= (uint)(uVar6 & 0xffff)) {
      mdb_assert_fail(mc->mc_txn->mt_env,"i < NUMKEYS(mp)","mdb_page_search_root",(char *)0x179f,
                      in_R8D);
    }
    bVar8 = false;
    iVar4 = mdb_page_get(mc,(ulong)CONCAT24(*(undefined2 *)
                                             ((long)pMVar3->mp_ptrs +
                                             ((ulong)pMVar3->mp_ptrs[uVar6 & 0xffff] - 0xc)),
                                            *(undefined4 *)
                                             ((long)pMVar3->mp_ptrs +
                                             ((ulong)pMVar3->mp_ptrs[uVar6 & 0xffff] - 0x10))),
                         &local_48,(int *)0x0);
    if (iVar4 == 0) {
      mc->mc_ki[mc->mc_top] = (indx_t)uVar6;
      uVar2 = mc->mc_snum;
      uVar6 = (ulong)uVar2;
      if (uVar6 < 0x20) {
        mc->mc_snum = uVar2 + 1;
        mc->mc_top = uVar2;
        mc->mc_pg[uVar6] = local_48;
        mc->mc_ki[uVar6] = 0;
        iVar4 = unaff_R13D;
      }
      else {
        puVar1 = &mc->mc_txn->mt_flags;
        *puVar1 = *puVar1 | 2;
        iVar4 = -0x7843;
      }
      bVar8 = uVar2 < 0x20;
      if ((flags & 1U) != 0 && bVar8) {
        iVar4 = mdb_page_touch(mc);
        if (iVar4 == 0) {
          local_48 = mc->mc_pg[mc->mc_top];
          bVar8 = true;
          iVar4 = unaff_R13D;
        }
        else {
          bVar8 = false;
        }
      }
    }
    unaff_R13D = iVar4;
    if (!bVar8) {
      return iVar4;
    }
  } while( true );
}

Assistant:

static int
mdb_page_search_root(MDB_cursor *mc, MDB_val *key, int flags)
{
	MDB_page	*mp = mc->mc_pg[mc->mc_top];
	int rc;
	DKBUF;

	while (IS_BRANCH(mp)) {
		MDB_node	*node;
		indx_t		i;

		DPRINTF(("branch page %"Y"u has %u keys", mp->mp_pgno, NUMKEYS(mp)));
		/* Don't assert on branch pages in the FreeDB. We can get here
		 * while in the process of rebalancing a FreeDB branch page; we must
		 * let that proceed. ITS#8336
		 */
		mdb_cassert(mc, !mc->mc_dbi || NUMKEYS(mp) > 1);
		DPRINTF(("found index 0 to page %"Y"u", NODEPGNO(NODEPTR(mp, 0))));

		if (flags & (MDB_PS_FIRST|MDB_PS_LAST)) {
			i = 0;
			if (flags & MDB_PS_LAST)
				i = NUMKEYS(mp) - 1;
		} else {
			int	 exact;
			node = mdb_node_search(mc, key, &exact);
			if (node == NULL)
				i = NUMKEYS(mp) - 1;
			else {
				i = mc->mc_ki[mc->mc_top];
				if (!exact) {
					mdb_cassert(mc, i > 0);
					i--;
				}
			}
			DPRINTF(("following index %u for key [%s]", i, DKEY(key)));
		}

		mdb_cassert(mc, i < NUMKEYS(mp));
		node = NODEPTR(mp, i);

		if ((rc = mdb_page_get(mc, NODEPGNO(node), &mp, NULL)) != 0)
			return rc;

		mc->mc_ki[mc->mc_top] = i;
		if ((rc = mdb_cursor_push(mc, mp)))
			return rc;

		if (flags & MDB_PS_MODIFY) {
			if ((rc = mdb_page_touch(mc)) != 0)
				return rc;
			mp = mc->mc_pg[mc->mc_top];
		}
	}

	if (!IS_LEAF(mp)) {
		DPRINTF(("internal error, index points to a %02X page!?",
		    mp->mp_flags));
		mc->mc_txn->mt_flags |= MDB_TXN_ERROR;
		return MDB_CORRUPTED;
	}

	DPRINTF(("found leaf page %"Y"u for key [%s]", mp->mp_pgno,
	    key ? DKEY(key) : "null"));
	mc->mc_flags |= C_INITIALIZED;
	mc->mc_flags &= ~C_EOF;

	return MDB_SUCCESS;
}